

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompel.cpp
# Opt level: O0

void __thiscall TPZCompEl::TPZCompEl(TPZCompEl *this,void **vtt,TPZCompMesh *mesh,TPZCompEl *copy)

{
  long lVar1;
  TPZCompEl **ppTVar2;
  TPZIntPoints *pTVar3;
  long in_RCX;
  TPZCompMesh *in_RDX;
  TPZChunkVector<TPZCompEl_*,_10> *in_RSI;
  TPZCompEl *in_RDI;
  int64_t index;
  
  *(_func_int ***)in_RDI = (in_RSI->super_TPZSavable)._vptr_TPZSavable;
  *(int64_t *)((long)&in_RDI->field_0x0 + *(long *)(*(long *)in_RDI + -0x60)) = in_RSI->fNElements;
  in_RDI->fIntegrationRule = (TPZIntPoints *)0x0;
  in_RDI->fMesh = in_RDX;
  lVar1 = *(long *)(in_RCX + 0x10);
  if (-1 < lVar1) {
    TPZCompMesh::ElementVec(in_RDX);
    ppTVar2 = TPZChunkVector<TPZCompEl_*,_10>::operator[](in_RSI,(int64_t)in_RDX);
    *ppTVar2 = in_RDI;
  }
  in_RDI->fIndex = lVar1;
  in_RDI->fReferenceIndex = *(int64_t *)(in_RCX + 0x18);
  if (*(long *)(in_RCX + 0x20) != 0) {
    pTVar3 = (TPZIntPoints *)(**(code **)(**(long **)(in_RCX + 0x20) + 0x48))();
    in_RDI->fIntegrationRule = pTVar3;
  }
  return;
}

Assistant:

TPZCompEl::TPZCompEl(TPZCompMesh &mesh, const TPZCompEl &copy): fIntegrationRule(0) {
    fMesh = &mesh;
    int64_t index = copy.fIndex;
    if(index >= 0) mesh.ElementVec()[index] = this;
    fIndex = index;
    fReferenceIndex = copy.fReferenceIndex;
    if (copy.fIntegrationRule) {
        fIntegrationRule = copy.fIntegrationRule->Clone();
    }
}